

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  TValue *obj;
  TValue n;
  TValue local_10;
  
  obj = index2adr(L,idx);
  if ((obj->tt != 3) && (obj = luaV_tonumber(obj,&local_10), obj == (TValue *)0x0)) {
    return 0;
  }
  return (long)(obj->value).n;
}

Assistant:

static lua_Integer lua_tointeger(lua_State*L,int idx){
TValue n;
const TValue*o=index2adr(L,idx);
if(tonumber(o,&n)){
lua_Integer res;
lua_Number num=nvalue(o);
lua_number2integer(res,num);
return res;
}
else
return 0;
}